

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

LabelInstr * __thiscall
IRBuilderAsmJs::CreateLabel(IRBuilderAsmJs *this,BranchInstr *branchInstr,uint *offset)

{
  IRKind IVar1;
  Instr *this_00;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  LabelInstr *this_01;
  LabelInstr *this_02;
  
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  uVar4 = *offset;
  do {
    if (this->m_offsetToInstructionCount <= uVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x434,"(offset < m_offsetToInstructionCount)",
                         "offset < m_offsetToInstructionCount");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      uVar4 = *offset;
    }
    this_00 = this->m_offsetToInstruction[uVar4];
    uVar4 = uVar4 + 1;
    *offset = uVar4;
  } while (this_00 == (Instr *)0x0);
  bVar3 = true;
  if ((this_00->m_prev == (Instr *)0x0) ||
     (this_01 = (LabelInstr *)IR::Instr::GetPrevRealInstrOrLabel(this_00),
     this_01 == (LabelInstr *)0x0)) {
    this_01 = (LabelInstr *)0x0;
  }
  else {
    IVar1 = (this_01->super_Instr).m_kind;
    if (IVar1 == InstrKindLabel) {
      return this_01;
    }
    if (IVar1 == InstrKindProfiledLabel) {
      return this_01;
    }
    bVar3 = false;
  }
  this_02 = IR::LabelInstr::New(Label,this->m_func,false);
  IR::Instr::SetByteCodeOffset(&this_02->super_Instr,*offset);
  if (bVar3) {
    IR::Instr::InsertBefore(this_00,&this_02->super_Instr);
  }
  else {
    IR::Instr::InsertAfter(&this_01->super_Instr,&this_02->super_Instr);
  }
  return this_02;
}

Assistant:

IR::LabelInstr *
IRBuilderAsmJs::CreateLabel(IR::BranchInstr * branchInstr, uint & offset)
{
    IR::Instr * targetInstr = nullptr;
    while (targetInstr == nullptr)
    {
        AssertOrFailFast(offset < m_offsetToInstructionCount);
        targetInstr = m_offsetToInstruction[offset];
        ++offset;
    }

    IR::Instr *instrPrev = targetInstr->m_prev;

    if (instrPrev)
    {
        instrPrev = targetInstr->GetPrevRealInstrOrLabel();
    }

    IR::LabelInstr * labelInstr;
    if (instrPrev && instrPrev->IsLabelInstr())
    {
        // Found an existing label at the right offset. Just reuse it.
        labelInstr = instrPrev->AsLabelInstr();
    }
    else
    {
        // No label at the desired offset. Create one.
        labelInstr = IR::LabelInstr::New(Js::OpCode::Label, m_func);
        labelInstr->SetByteCodeOffset(offset);
        if (instrPrev)
        {
            instrPrev->InsertAfter(labelInstr);
        }
        else
        {
            targetInstr->InsertBefore(labelInstr);
        }
    }
    return labelInstr;
}